

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O1

void __thiscall
ncnn::CopyTo::resolve_copyto_offset
          (CopyTo *this,Mat *self_blob,int *_woffset,int *_hoffset,int *_doffset,int *_coffset)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  void *pvVar8;
  void *pvVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int local_48 [6];
  int _axes [4];
  
  pvVar8 = (this->starts).data;
  if ((pvVar8 != (void *)0x0) && ((long)(this->starts).c * (this->starts).cstep != 0)) {
    uVar1 = self_blob->dims;
    uVar2 = self_blob->w;
    uVar3 = self_blob->h;
    uVar4 = self_blob->d;
    uVar5 = self_blob->c;
    *_woffset = 0;
    *_hoffset = 0;
    *_doffset = 0;
    *_coffset = 0;
    pvVar9 = (this->axes).data;
    local_48[0] = 0;
    local_48[1] = 1;
    local_48[2] = 2;
    local_48[3] = 3;
    uVar6 = (this->axes).w;
    uVar10 = uVar1;
    if (((ulong)uVar6 != 0) && (uVar10 = uVar6, 0 < (int)uVar6)) {
      uVar14 = 0;
      do {
        iVar13 = *(int *)((long)pvVar9 + uVar14 * 4);
        local_48[uVar14] = (iVar13 >> 0x1f & uVar1) + iVar13;
        uVar14 = uVar14 + 1;
      } while (uVar6 != uVar14);
    }
    if (0 < (int)uVar10) {
      uVar14 = 0;
      do {
        iVar13 = *(int *)((long)pvVar8 + uVar14 * 4);
        iVar11 = 0;
        if (uVar1 == 1) {
          if (iVar13 == -0xe9) {
            iVar13 = iVar11;
          }
          *_woffset = (iVar13 >> 0x1f & uVar2) + iVar13;
        }
        iVar7 = local_48[uVar14];
        if (uVar1 == 2) {
          if (iVar7 == 0) {
            if (iVar13 == -0xe9) {
              iVar13 = iVar11;
            }
            *_hoffset = (iVar13 >> 0x1f & uVar3) + iVar13;
          }
          if (iVar7 == 1) {
            if (iVar13 == -0xe9) {
              iVar13 = iVar11;
            }
            *_woffset = (iVar13 >> 0x1f & uVar2) + iVar13;
          }
        }
        if (uVar1 == 3) {
          iVar11 = iVar13;
          if (iVar7 == 0) {
            iVar11 = 0;
            if (iVar13 != -0xe9) {
              iVar11 = iVar13;
            }
            *_coffset = (iVar11 >> 0x1f & uVar5) + iVar11;
          }
          iVar12 = iVar11;
          if (iVar7 == 1) {
            iVar12 = 0;
            if (iVar11 != -0xe9) {
              iVar12 = iVar11;
            }
            *_hoffset = (iVar12 >> 0x1f & uVar3) + iVar12;
          }
          iVar13 = iVar12;
          if (iVar7 == 2) {
            iVar13 = 0;
            if (iVar12 != -0xe9) {
              iVar13 = iVar12;
            }
            *_woffset = (iVar13 >> 0x1f & uVar2) + iVar13;
          }
        }
        if (uVar1 == 4) {
          iVar11 = iVar13;
          if (iVar7 == 0) {
            iVar11 = 0;
            if (iVar13 != -0xe9) {
              iVar11 = iVar13;
            }
            *_coffset = (iVar11 >> 0x1f & uVar5) + iVar11;
          }
          iVar13 = iVar11;
          if (iVar7 == 1) {
            iVar13 = 0;
            if (iVar11 != -0xe9) {
              iVar13 = iVar11;
            }
            *_doffset = (iVar13 >> 0x1f & uVar4) + iVar13;
          }
          iVar11 = iVar13;
          if (iVar7 == 2) {
            iVar11 = 0;
            if (iVar13 != -0xe9) {
              iVar11 = iVar13;
            }
            *_hoffset = (iVar11 >> 0x1f & uVar3) + iVar11;
          }
          if (iVar7 == 3) {
            iVar13 = 0;
            if (iVar11 != -0xe9) {
              iVar13 = iVar11;
            }
            *_woffset = (iVar13 >> 0x1f & uVar2) + iVar13;
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar10 != uVar14);
    }
    return;
  }
  *_woffset = this->woffset;
  *_hoffset = this->hoffset;
  *_doffset = this->doffset;
  *_coffset = this->coffset;
  return;
}

Assistant:

NCNN_FORCEINLINE bool Mat::empty() const
{
    return data == 0 || total() == 0;
}